

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalized.hpp
# Opt level: O0

void ExchCXX::
     kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
     eval_exc_polar(double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
                   double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  double in_XMM0_Qa;
  double *in_XMM1_Qa;
  double unaff_retaddr;
  double in_stack_00000008;
  double TAU_B;
  double TAU_A;
  
  mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar
            (lapl_b,tau_a,(double)eps,TAU_A,TAU_B,in_stack_00000008,unaff_retaddr,in_XMM0_Qa,
             sigma_bb,in_XMM1_Qa);
  mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar
            (lapl_b,tau_a,(double)eps,TAU_A,TAU_B,in_stack_00000008,unaff_retaddr,in_XMM0_Qa,
             sigma_bb,in_XMM1_Qa);
  mgga_screening_interface<ExchCXX::BuiltinSCAN_X>::eval_exc_polar
            (lapl_b,tau_a,(double)eps,TAU_A,TAU_B,in_stack_00000008,unaff_retaddr,in_XMM0_Qa,
             sigma_bb,in_XMM1_Qa);
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    double TAU_A, TAU_B;
    ke_traits::eval_exc_polar(rho_a, 0.0, sigma_aa, 0.0, 0.0, lapl_a, 0.0, 0.0, 0.0, TAU_A);
    ke_traits::eval_exc_polar(rho_b, 0.0, sigma_bb, 0.0, 0.0, lapl_b, 0.0, 0.0, 0.0, TAU_B);

    TAU_A *= rho_a;
    TAU_B *= rho_b;
    xc_traits::eval_exc_polar(rho_a, rho_b, sigma_aa, sigma_ab, sigma_bb, lapl_a, lapl_b, TAU_A, TAU_B, eps);

  }